

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base32.cpp
# Opt level: O1

void __thiscall Base32_ThirtyOne_Test::TestBody(Base32_ThirtyOne_Test *this)

{
  uint128 val;
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertHelper in_stack_ffffffffffffffb8;
  internal in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  pstore::base32::convert<unsigned_int>(&local_30,0x1f);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&stack0xffffffffffffffc0,"convert (31U)","\"7\"",&local_30,
             (char (*) [2])0x209063);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_ffffffffffffffc0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_base32.cpp"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  val.v_._8_1_ = in_stack_ffffffffffffffc0;
  val.v_._0_8_ = in_stack_ffffffffffffffb8.data_;
  val.v_._9_7_ = in_stack_ffffffffffffffc1;
  pstore::base32::convert<pstore::uint128>(&local_30,(base32 *)0x1f,val);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&stack0xffffffffffffffc0,"convert (uint128{31U})","\"7\"",&local_30,
             (char (*) [2])0x209063);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_ffffffffffffffc0 == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_base32.cpp"
               ,0x2e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST (Base32, ThirtyOne) {
    using pstore::uint128;
    using pstore::base32::convert;
    EXPECT_EQ (convert (31U), "7");
    EXPECT_EQ (convert (uint128{31U}), "7");
}